

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_model(Net *this,char *modelpath)

{
  FILE *__stream;
  char *in_RSI;
  Net *unaff_retaddr;
  int ret;
  FILE *fp;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  __stream = fopen(in_RSI,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed",in_RSI);
    fprintf(_stderr,"\n");
    iVar1 = -1;
  }
  else {
    iVar1 = load_model(unaff_retaddr,
                       (FILE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int Net::load_model(const char* modelpath)
{
    FILE* fp = fopen(modelpath, "rb");
    if (!fp)
    {
        NCNN_LOGE("fopen %s failed", modelpath);
        return -1;
    }

    int ret = load_model(fp);
    fclose(fp);
    return ret;
}